

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void QPDF::decryptStream(shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
                        QPDF *qpdf_for_warning,Pipeline **pipeline,QPDFObjGen og,
                        QPDFObjectHandle *stream_dict,bool is_root_metadata,
                        unique_ptr<Pipeline,_std::default_delete<Pipeline>_> *decrypt_pipeline)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  qpdf_offset_t offset;
  pointer pPVar6;
  QPDFObjGen QVar7;
  undefined1 use_aes_00;
  bool local_6c3;
  bool local_66a;
  unsigned_long local_5a0;
  int local_594;
  uchar *local_590;
  unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_> local_588;
  undefined8 local_580;
  uchar *local_578;
  undefined1 local_569;
  unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_> local_568;
  QPDFObjGen local_560;
  shared_ptr<QPDF::EncryptionParameters> local_558;
  undefined1 local_548 [8];
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  allocator<char> local_4e1;
  string local_4e0;
  QPDFExc local_4c0;
  allocator<char> local_439;
  string local_438 [32];
  QPDFObjectHandle local_418;
  shared_ptr<QPDF::EncryptionParameters> local_408;
  byte local_3f4;
  byte local_3f3;
  byte local_3f2;
  allocator<char> local_3f1;
  string local_3f0 [32];
  QPDFObjectHandle local_3d0;
  undefined1 local_3c0 [8];
  QPDFObjectHandle crypt_params;
  string local_3a8;
  QPDFObjectHandle local_388;
  int local_378;
  allocator<char> local_371;
  int i;
  undefined1 local_350 [8];
  QPDFObjectHandle decode;
  string local_338 [32];
  undefined1 local_318 [8];
  QPDFObjectHandle filter;
  string local_300 [32];
  QPDFObjectHandle local_2e0;
  allocator<char> local_2c9;
  string local_2c8 [32];
  QPDFObjectHandle local_2a8;
  allocator<char> local_291;
  string local_290 [32];
  QPDFObjectHandle local_270;
  shared_ptr<QPDF::EncryptionParameters> local_260;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  QPDFObjectHandle decode_parms;
  string local_1c0 [32];
  QPDFObjectHandle local_1a0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160 [32];
  QPDFObjectHandle local_140;
  allocator<char> local_129;
  undefined1 local_128 [8];
  string method_source;
  encryption_method_e method;
  bool use_aes;
  string local_f8 [32];
  QPDFObjectHandle local_d8;
  string local_c8;
  allocator<char> local_91;
  string local_90 [32];
  QPDFObjectHandle local_70;
  undefined1 local_60 [8];
  string type;
  bool is_root_metadata_local;
  QPDFObjectHandle *stream_dict_local;
  Pipeline **pipeline_local;
  QPDF *qpdf_for_warning_local;
  shared_ptr<InputSource> *file_local;
  shared_ptr<QPDF::EncryptionParameters> *encp_local;
  QPDFObjGen og_local;
  
  type.field_2._M_local_buf[0xf] = is_root_metadata;
  QVar7 = og;
  std::__cxx11::string::string((string *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"/Type",&local_91);
  QPDFObjectHandle::getKey(&local_70,(string *)stream_dict);
  bVar1 = QPDFObjectHandle::isName(&local_70);
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f8,"/Type",(allocator<char> *)&use_aes)
    ;
    QPDFObjectHandle::getKey(&local_d8,(string *)stream_dict);
    QPDFObjectHandle::getName_abi_cxx11_(&local_c8,&local_d8);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&use_aes);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"/XRef");
  if (bVar1) {
    QTC::TC("qpdf","QPDF_encryption xref stream from encrypted file",0);
    goto LAB_0035095d;
  }
  method_source.field_2._M_local_buf[0xf] = '\0';
  peVar4 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)encp);
  use_aes_00 = (undefined1)QVar7.obj;
  if (3 < peVar4->encryption_V) {
    method_source.field_2._8_4_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,"/StmF from /Encrypt dictionary",&local_129);
    std::allocator<char>::~allocator(&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_160,"/Filter",&local_161);
    QPDFObjectHandle::getKey(&local_140,(string *)stream_dict);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"/Crypt",&local_189);
    bVar1 = QPDFObjectHandle::isOrHasName(&local_140,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    QPDFObjectHandle::~QPDFObjectHandle(&local_140);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    use_aes_00 = (undefined1)QVar7.obj;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c0,"/DecodeParms",
                 (allocator<char> *)
                 ((long)&decode_parms.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey(&local_1a0,(string *)stream_dict);
      bVar1 = QPDFObjectHandle::isDictionary(&local_1a0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&decode_parms.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      use_aes_00 = (undefined1)QVar7.obj;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1f8,"/DecodeParms",&local_1f9);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1d8,(string *)stream_dict);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"/CryptFilterDecodeParms",&local_221);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"",&local_249);
        bVar1 = QPDFObjectHandle::isDictionaryOfType
                          ((QPDFObjectHandle *)local_1d8,&local_220,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator(&local_249);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
        if (bVar1) {
          QTC::TC("qpdf","QPDF_encryption stream crypt filter",0);
          std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_260,encp);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_290,"/Name",&local_291);
          QPDFObjectHandle::getKey(&local_270,(string *)local_1d8);
          method_source.field_2._8_4_ = interpretCF(&local_260,&local_270);
          QPDFObjectHandle::~QPDFObjectHandle(&local_270);
          std::__cxx11::string::~string(local_290);
          std::allocator<char>::~allocator(&local_291);
          std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_260);
          std::__cxx11::string::operator=((string *)local_128,"stream\'s Crypt decode parameters");
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1d8);
      }
      else {
        std::allocator<char>::allocator();
        filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._6_1_ = 0;
        filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._5_1_ = 0;
        filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_1_ = 0;
        std::__cxx11::string::string<std::allocator<char>>(local_2c8,"/DecodeParms",&local_2c9);
        QPDFObjectHandle::getKey(&local_2a8,(string *)stream_dict);
        bVar1 = QPDFObjectHandle::isArray(&local_2a8);
        local_66a = false;
        if (bVar1) {
          std::allocator<char>::allocator();
          filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (local_300,"/Filter",
                     (allocator<char> *)
                     ((long)&filter.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._5_1_ = 1;
          QPDFObjectHandle::getKey(&local_2e0,(string *)stream_dict);
          filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_1_ = 1;
          local_66a = QPDFObjectHandle::isArray(&local_2e0);
        }
        if ((filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_1_ & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_2e0);
        }
        if ((filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._5_1_ & 1) != 0) {
          std::__cxx11::string::~string(local_300);
        }
        if ((filter.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&filter.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
        }
        QPDFObjectHandle::~QPDFObjectHandle(&local_2a8);
        std::__cxx11::string::~string(local_2c8);
        std::allocator<char>::~allocator(&local_2c9);
        use_aes_00 = (undefined1)QVar7.obj;
        if (local_66a != false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_338,"/Filter",
                     (allocator<char> *)
                     ((long)&decode.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_318,(string *)stream_dict);
          std::__cxx11::string::~string(local_338);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&decode.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&i,"/DecodeParms",&local_371)
          ;
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_350,(string *)stream_dict);
          std::__cxx11::string::~string((string *)&i);
          std::allocator<char>::~allocator(&local_371);
          iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_318);
          iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_350);
          use_aes_00 = (undefined1)QVar7.obj;
          if (iVar3 == iVar2) {
            local_378 = 0;
            while( true ) {
              iVar3 = local_378;
              iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_318);
              use_aes_00 = (undefined1)QVar7.obj;
              if (iVar2 <= iVar3) break;
              QPDFObjectHandle::getArrayItem(&local_388,(int)local_318);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3a8,"/Crypt",
                         (allocator<char> *)
                         ((long)&crypt_params.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              bVar1 = QPDFObjectHandle::isNameAndEquals(&local_388,&local_3a8);
              std::__cxx11::string::~string((string *)&local_3a8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&crypt_params.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 7));
              QPDFObjectHandle::~QPDFObjectHandle(&local_388);
              if (bVar1) {
                QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_3c0,(int)local_350);
                local_3f2 = 0;
                local_3f3 = 0;
                local_3f4 = 0;
                bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_3c0);
                local_6c3 = false;
                if (bVar1) {
                  std::allocator<char>::allocator();
                  local_3f2 = 1;
                  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"/Name",&local_3f1);
                  local_3f3 = 1;
                  QPDFObjectHandle::getKey(&local_3d0,(string *)local_3c0);
                  local_3f4 = 1;
                  local_6c3 = QPDFObjectHandle::isName(&local_3d0);
                }
                if ((local_3f4 & 1) != 0) {
                  QPDFObjectHandle::~QPDFObjectHandle(&local_3d0);
                }
                if ((local_3f3 & 1) != 0) {
                  std::__cxx11::string::~string(local_3f0);
                }
                if ((local_3f2 & 1) != 0) {
                  std::allocator<char>::~allocator(&local_3f1);
                }
                if (local_6c3 != false) {
                  QTC::TC("qpdf","QPDF_encrypt crypt array",0);
                  std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_408,encp);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>(local_438,"/Name",&local_439);
                  QPDFObjectHandle::getKey(&local_418,(string *)local_3c0);
                  method_source.field_2._8_4_ = interpretCF(&local_408,&local_418);
                  QPDFObjectHandle::~QPDFObjectHandle(&local_418);
                  std::__cxx11::string::~string(local_438);
                  std::allocator<char>::~allocator(&local_439);
                  std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_408);
                  std::__cxx11::string::operator=
                            ((string *)local_128,"stream\'s Crypt decode parameters (array)");
                }
                QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3c0);
              }
              local_378 = local_378 + 1;
            }
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_350);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_318);
        }
      }
    }
    if (method_source.field_2._8_4_ == 1) {
      peVar4 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)encp);
      if (((peVar4->encrypt_metadata & 1U) == 0) && ((type.field_2._M_local_buf[0xf] & 1U) != 0)) {
        QTC::TC("qpdf","QPDF_encryption cleartext metadata",0);
        method_source.field_2._8_4_ = 0;
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)encp);
        method_source.field_2._8_4_ = peVar4->cf_stream;
      }
    }
    method_source.field_2._M_local_buf[0xf] = '\0';
    switch(method_source.field_2._8_4_) {
    case 0:
      bVar1 = true;
      goto LAB_003506ec;
    default:
      peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file);
      iVar3 = (*peVar5->_vptr_InputSource[3])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"",&local_4e1);
      peVar5 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)file);
      offset = InputSource::getLastOffset(peVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&key.field_2 + 8),"unknown encryption filter for streams (check ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
      ;
      std::operator+(&local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&key.field_2 + 8),"); streams may be decrypted improperly");
      QPDFExc::QPDFExc(&local_4c0,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar3),
                       &local_4e0,offset,&local_508);
      use_aes_00 = (undefined1)offset;
      warn(qpdf_for_warning,&local_4c0);
      QPDFExc::~QPDFExc(&local_4c0);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      peVar4 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)encp);
      peVar4->cf_stream = e_aes;
      method_source.field_2._M_local_buf[0xf] = '\x01';
      break;
    case 2:
      break;
    case 3:
      method_source.field_2._M_local_buf[0xf] = '\x01';
      break;
    case 4:
      method_source.field_2._M_local_buf[0xf] = '\x01';
    }
    bVar1 = false;
LAB_003506ec:
    std::__cxx11::string::~string((string *)local_128);
    if (bVar1) goto LAB_0035095d;
  }
  std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_558,encp);
  QVar7.obj = (byte)method_source.field_2._M_local_buf[0xf] & 1;
  QVar7.gen = 0;
  local_560 = og;
  getKeyForObject_abi_cxx11_
            ((string *)local_548,(QPDF *)&local_558,(shared_ptr<QPDF::EncryptionParameters> *)og,
             QVar7,(bool)use_aes_00);
  std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_558);
  if ((method_source.field_2._M_local_buf[0xf] & 1U) == 0) {
    QTC::TC("qpdf","QPDF_encryption rc4 decode stream",0);
    local_590 = QUtil::unsigned_char_pointer((string *)local_548);
    local_5a0 = std::__cxx11::string::length();
    local_594 = toI<unsigned_long>(&local_5a0);
    std::make_unique<Pl_RC4,char_const(&)[22],Pipeline*&,unsigned_char*,int>
              ((char (*) [22])&local_588,(Pipeline **)"RC4 stream decryption",(uchar **)pipeline,
               (int *)&local_590);
    std::unique_ptr<Pipeline,std::default_delete<Pipeline>>::operator=
              ((unique_ptr<Pipeline,std::default_delete<Pipeline>> *)decrypt_pipeline,&local_588);
    std::unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_>::~unique_ptr(&local_588);
  }
  else {
    QTC::TC("qpdf","QPDF_encryption aes decode stream",0);
    local_569 = 0;
    local_578 = QUtil::unsigned_char_pointer((string *)local_548);
    local_580 = std::__cxx11::string::length();
    std::make_unique<Pl_AES_PDF,char_const(&)[22],Pipeline*&,bool,unsigned_char*,unsigned_long>
              ((char (*) [22])&local_568,(Pipeline **)"AES stream decryption",(bool *)pipeline,
               (uchar **)&local_569,(unsigned_long *)&local_578);
    std::unique_ptr<Pipeline,std::default_delete<Pipeline>>::operator=
              ((unique_ptr<Pipeline,std::default_delete<Pipeline>> *)decrypt_pipeline,&local_568);
    std::unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_>::~unique_ptr(&local_568);
  }
  pPVar6 = std::unique_ptr<Pipeline,_std::default_delete<Pipeline>_>::get(decrypt_pipeline);
  *pipeline = pPVar6;
  std::__cxx11::string::~string((string *)local_548);
LAB_0035095d:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void
QPDF::decryptStream(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    Pipeline*& pipeline,
    QPDFObjGen og,
    QPDFObjectHandle& stream_dict,
    bool is_root_metadata,
    std::unique_ptr<Pipeline>& decrypt_pipeline)
{
    std::string type;
    if (stream_dict.getKey("/Type").isName()) {
        type = stream_dict.getKey("/Type").getName();
    }
    if (type == "/XRef") {
        QTC::TC("qpdf", "QPDF_encryption xref stream from encrypted file");
        return;
    }
    bool use_aes = false;
    if (encp->encryption_V >= 4) {
        encryption_method_e method = e_unknown;
        std::string method_source = "/StmF from /Encrypt dictionary";

        if (stream_dict.getKey("/Filter").isOrHasName("/Crypt")) {
            if (stream_dict.getKey("/DecodeParms").isDictionary()) {
                QPDFObjectHandle decode_parms = stream_dict.getKey("/DecodeParms");
                if (decode_parms.isDictionaryOfType("/CryptFilterDecodeParms")) {
                    QTC::TC("qpdf", "QPDF_encryption stream crypt filter");
                    method = interpretCF(encp, decode_parms.getKey("/Name"));
                    method_source = "stream's Crypt decode parameters";
                }
            } else if (
                stream_dict.getKey("/DecodeParms").isArray() &&
                stream_dict.getKey("/Filter").isArray()) {
                QPDFObjectHandle filter = stream_dict.getKey("/Filter");
                QPDFObjectHandle decode = stream_dict.getKey("/DecodeParms");
                if (filter.getArrayNItems() == decode.getArrayNItems()) {
                    for (int i = 0; i < filter.getArrayNItems(); ++i) {
                        if (filter.getArrayItem(i).isNameAndEquals("/Crypt")) {
                            QPDFObjectHandle crypt_params = decode.getArrayItem(i);
                            if (crypt_params.isDictionary() &&
                                crypt_params.getKey("/Name").isName()) {
                                QTC::TC("qpdf", "QPDF_encrypt crypt array");
                                method = interpretCF(encp, crypt_params.getKey("/Name"));
                                method_source = "stream's Crypt decode parameters (array)";
                            }
                        }
                    }
                }
            }
        }

        if (method == e_unknown) {
            if ((!encp->encrypt_metadata) && is_root_metadata) {
                QTC::TC("qpdf", "QPDF_encryption cleartext metadata");
                method = e_none;
            } else {
                method = encp->cf_stream;
            }
        }
        use_aes = false;
        switch (method) {
        case e_none:
            return;
            break;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            // filter local to this stream.
            qpdf_for_warning.warn(QPDFExc(
                qpdf_e_damaged_pdf,
                file->getName(),
                "",
                file->getLastOffset(),
                "unknown encryption filter for streams (check " + method_source +
                    "); streams may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_stream.  Assume we'd want to use AES if V == 4.
            encp->cf_stream = e_aes;
            use_aes = true;
            break;
        }
    }
    std::string key = getKeyForObject(encp, og, use_aes);
    if (use_aes) {
        QTC::TC("qpdf", "QPDF_encryption aes decode stream");
        decrypt_pipeline = std::make_unique<Pl_AES_PDF>(
            "AES stream decryption",
            pipeline,
            false,
            QUtil::unsigned_char_pointer(key),
            key.length());
    } else {
        QTC::TC("qpdf", "QPDF_encryption rc4 decode stream");
        decrypt_pipeline = std::make_unique<Pl_RC4>(
            "RC4 stream decryption",
            pipeline,
            QUtil::unsigned_char_pointer(key),
            toI(key.length()));
    }
    pipeline = decrypt_pipeline.get();
}